

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

void __thiscall
nonstd::span_lite::span<int_const,2ul>::span<int,2ul>
          (span<int_const,2ul> *this,span<int,_2UL> *other)

{
  size_type sVar1;
  
  *(pointer *)this = other->data_;
  sVar1 = other->size_;
  *(size_type *)(this + 8) = sVar1;
  if (sVar1 == 2) {
    return;
  }
  detail::report_contract_violation
            (
            "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1147: Precondition violation."
            );
  return;
}

Assistant:

span_constexpr pointer data() const span_noexcept
    {
        return data_;
    }